

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O2

void __thiscall Grid::setslime(Grid *this,point p,bool slime)

{
  uint uVar1;
  uint uVar2;
  cg_other *this_00;
  int iVar3;
  bool bVar4;
  uint *puVar5;
  pointer pcVar6;
  cgo_char local_28;
  
  bVar4 = cg_box::contains((this->box).ptr,p);
  if (bVar4) {
    uniquify<cg_box>(&this->box);
    puVar5 = (uint *)cg_box::at((this->box).ptr,p);
    uVar1 = this->SLIMEBIT;
    iVar3 = this->SLIMEBIT_SHIFT;
    uVar2 = *puVar5;
    puVar5 = (uint *)cg_box::at((this->box).ptr,p);
    *puVar5 = (uint)slime << ((byte)iVar3 & 0x1f) | ~uVar1 & uVar2;
  }
  else {
    uniquify<cg_other>(&this->other);
    this_00 = (this->other).ptr;
    for (pcVar6 = (this_00->data).
                  super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pcVar6 != (this_00->data).
                  super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pcVar6 = pcVar6 + 1) {
      if (pcVar6->p == p) {
        pcVar6->ch = (uint)slime << ((byte)this->SLIMEBIT_SHIFT & 0x1f) |
                     ~this->SLIMEBIT & pcVar6->ch;
        return;
      }
    }
    local_28.ch = this->SLIMEBIT | 0x80000000;
    local_28.p = p;
    std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::
    emplace_back<cg_other::cgo_char>(&this_00->data,&local_28);
  }
  return;
}

Assistant:

void Grid::setslime(point p, bool slime) {
    if (box->contains(p)) {
        uniquify(box);
        box->at(p) = (box->at(p) & ~SLIMEBIT) | (slime << SLIMEBIT_SHIFT);
        return;
    }
    uniquify(other);
    for (auto &d: other->data) {
        if (d.p == p) {
            d.ch = (d.ch & ~SLIMEBIT) | (slime << SLIMEBIT_SHIFT);
            return;
        }
    }
    other->data.push_back({ p, OUT_CHAR | SLIMEBIT });
}